

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_addclause(sat_solver *s,lit *begin,lit *end)

{
  bool bVar1;
  int iVar2;
  lit lVar3;
  int iVar4;
  int *pBeg;
  lit *pEnd;
  char *pcVar5;
  int local_54;
  int RetValue;
  lit l;
  lit last;
  int maxvar;
  lit *j;
  lit *i;
  lit *end_local;
  lit *begin_local;
  sat_solver *s_local;
  
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x6ca,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  j = begin;
  if (s->fPrintClause != 0) {
    for (; j < end; j = j + 1) {
      pcVar5 = "";
      if ((*j & 1U) != 0) {
        pcVar5 = "!";
      }
      printf("%s%d ",pcVar5,(ulong)(uint)(*j >> 1));
    }
    printf("\n");
  }
  veci_resize(&s->temp_clause,0);
  for (j = begin; j < end; j = j + 1) {
    veci_push(&s->temp_clause,*j);
  }
  pBeg = veci_begin(&s->temp_clause);
  iVar2 = veci_size(&s->temp_clause);
  pEnd = pBeg + iVar2;
  l = lit_var(*pBeg);
  j = pBeg;
  while (j = j + 1, j < pEnd) {
    lVar3 = *j;
    iVar2 = lit_var(lVar3);
    if (l < iVar2) {
      local_54 = lit_var(lVar3);
    }
    else {
      local_54 = l;
    }
    l = local_54;
    _last = j;
    while( true ) {
      bVar1 = false;
      if (pBeg < _last) {
        bVar1 = lVar3 < _last[-1];
      }
      if (!bVar1) break;
      *_last = _last[-1];
      _last = _last + -1;
    }
    *_last = lVar3;
  }
  sat_solver_setnvars(s,l + 1);
  if ((s->pStore != (void *)0x0) &&
     (iVar2 = Sto_ManAddClause((Sto_Man_t *)s->pStore,pBeg,pEnd), iVar2 == 0)) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x6e8,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  RetValue = -2;
  _last = pBeg;
  j = pBeg;
  while( true ) {
    if (pEnd <= j) {
      if (_last == pBeg) {
        s_local._4_4_ = 0;
      }
      else if ((long)_last - (long)pBeg >> 2 == 1) {
        s_local._4_4_ = sat_solver_enqueue(s,*pBeg,0);
      }
      else {
        sat_solver_clause_new(s,pBeg,_last,0);
        s_local._4_4_ = 1;
      }
      return s_local._4_4_;
    }
    iVar2 = *j;
    lVar3 = lit_neg(RetValue);
    if (iVar2 == lVar3) break;
    iVar2 = lit_var(*j);
    iVar2 = var_value(s,iVar2);
    iVar4 = lit_sign(*j);
    if (iVar2 == iVar4) {
      return 1;
    }
    if (*j != RetValue) {
      iVar2 = lit_var(*j);
      iVar2 = var_value(s,iVar2);
      if (iVar2 == 3) {
        RetValue = *j;
        *_last = RetValue;
        _last = _last + 1;
      }
    }
    j = j + 1;
  }
  return 1;
}

Assistant:

int sat_solver_addclause(sat_solver* s, lit* begin, lit* end)
{
    lit *i,*j;
    int maxvar;
    lit last;
    assert( begin < end );
    if ( s->fPrintClause )
    {
        for ( i = begin; i < end; i++ )
            printf( "%s%d ", (*i)&1 ? "!":"", (*i)>>1 );
        printf( "\n" );
    }

    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver_setnvars(s,maxvar+1);

    ///////////////////////////////////
    // add clause to internal storage
    if ( s->pStore )
    {
        int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, begin, end );
        assert( RetValue );
        (void) RetValue;
    }
    ///////////////////////////////////

    // delete duplicates
    last = lit_Undef;
    for (i = j = begin; i < end; i++){
        //printf("lit: "L_LIT", value = %d\n", L_lit(*i), (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]));
        if (*i == lit_neg(last) || var_value(s, lit_var(*i)) == lit_sign(*i))
            return true;   // tautology
        else if (*i != last && var_value(s, lit_var(*i)) == varX)
            last = *j++ = *i;
    }
//    j = i;

    if (j == begin)          // empty clause
        return false;

    if (j - begin == 1) // unit clause
        return sat_solver_enqueue(s,*begin,0);

    // create new clause
    sat_solver_clause_new(s,begin,j,0);
    return true;
}